

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::EntryPointInfo::EnsureIsReadyToCall(EntryPointInfo *this)

{
  ProcessJitTransferData(this);
  return;
}

Assistant:

void EntryPointInfo::EnsureIsReadyToCall()
    {
        ProcessJitTransferData();

#if ENABLE_OOP_NATIVE_CODEGEN
#if !FLOATVAR
        if (JITManager::GetJITManager()->IsOOPJITEnabled())
        {
            this->GetOOPNativeEntryPointData()->ProcessNumberPageSegments(GetScriptContext());
        }
#endif
#endif
    }